

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::display<unsigned_char>(CImgDisplay *this,CImg<unsigned_char> *img)

{
  bool bVar1;
  uchar *puVar2;
  CImgArgumentException *this_00;
  CImg *in_RSI;
  CImgDisplay *in_RDI;
  undefined4 uVar3;
  bool in_stack_00000042;
  bool in_stack_00000043;
  uint in_stack_00000044;
  char *in_stack_00000048;
  undefined1 in_stack_0000037f;
  CImg<unsigned_char> *in_stack_00000380;
  CImgDisplay *in_stack_00000388;
  undefined1 in_stack_ffffffffffffffa7;
  CImgDisplay *in_stack_ffffffffffffffa8;
  char *pcVar4;
  char local_31;
  CImgDisplay *local_8;
  
  puVar2 = cimg_library::CImg::operator_cast_to_unsigned_char_(in_RSI);
  if (puVar2 == (uchar *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    local_31 = '\"';
    if (in_RDI->_title == (char *)0x0) {
      local_31 = '[';
    }
    if (in_RDI->_title == (char *)0x0) {
      pcVar4 = "untitled";
    }
    else {
      pcVar4 = in_RDI->_title;
    }
    uVar3 = 0x5d;
    if (in_RDI->_title != (char *)0x0) {
      uVar3 = 0x22;
    }
    CImgArgumentException::CImgArgumentException
              (this_00,"[instance(%u,%u,%u,%c%s%c)] CImgDisplay::display() : Empty specified image."
               ,(ulong)in_RDI->_width,(ulong)in_RDI->_height,(ulong)in_RDI->_normalization,
               (ulong)(uint)(int)local_31,pcVar4,uVar3);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  bVar1 = is_empty(in_RDI);
  if (bVar1) {
    local_8 = assign<unsigned_char>
                        (this,img,in_stack_00000048,in_stack_00000044,in_stack_00000043,
                         in_stack_00000042);
  }
  else {
    render<unsigned_char>(in_stack_00000388,in_stack_00000380,(bool)in_stack_0000037f);
    local_8 = paint(in_stack_ffffffffffffffa8,(bool)in_stack_ffffffffffffffa7);
  }
  return local_8;
}

Assistant:

CImgDisplay& display(const CImg<T>& img) {
      if (!img)
        throw CImgArgumentException(_cimgdisplay_instance
                                    "display() : Empty specified image.",
                                    cimgdisplay_instance);
      if (is_empty()) return assign(img);
      return render(img).paint(false);
    }